

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetSetter_Internal<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  byte bVar1;
  PropertyAttributes PVar2;
  code *pcVar3;
  bool bVar4;
  unsigned_short uVar5;
  uint32 index;
  DescriptorFlags DVar6;
  undefined4 *puVar7;
  Var pvVar8;
  int local_54;
  DictionaryPropertyDescriptor<unsigned_short> *pDStack_50;
  int i;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  ScriptContext *local_38;
  
  propertyRecord = (PropertyRecord *)info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_38 = requestContext;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x284,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    requestContext = local_38;
  }
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar4) {
    DVar6 = None;
    if ((pDStack_50->Attributes & 8) == 0) {
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(pDStack_50);
      if (uVar5 == 0xffff) {
        uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDStack_50);
        DVar6 = None;
        if (uVar5 != 0xffff) {
          uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDStack_50);
          pvVar8 = DynamicObject::GetSlot(instance,(uint)uVar5);
          *setterValue = pvVar8;
          uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDStack_50);
          DVar6 = Accessor;
          if (propertyRecord != (PropertyRecord *)0x0) {
            PVar2 = pDStack_50->Attributes;
            (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = (_func_int **)instance;
            *(unsigned_short *)&propertyRecord->pid = uVar5;
            *(PropertyAttributes *)((long)&propertyRecord->pid + 2) = PVar2;
            *(undefined1 *)((long)&propertyRecord->pid + 3) = 2;
          }
        }
      }
      else {
        bVar1 = pDStack_50->Attributes;
        if ((bVar1 & 0x10) == 0) {
          DVar6 = WritableData;
          if ((bVar1 & 4) == 0) {
            DVar6 = (uint)(bVar1 >> 7) * 8 + Data;
          }
        }
        else {
          DVar6 = (uint)(bVar1 >> 7) * 4 + WritableData;
        }
      }
    }
  }
  else {
    bVar4 = DynamicObject::HasObjectArray(instance);
    DVar6 = None;
    if ((bVar4) && (descriptor[2].flags == PreventFalseReference)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
      DVar6 = GetItemSetter(this,instance,index,setterValue,requestContext);
    }
  }
  return DVar6;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter_Internal(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DictionaryPropertyDescriptor<T>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetSetterFromDescriptor<allowLetConstGlobal>(instance, descriptor, setterValue, info);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::GetItemSetter(instance, propertyRecord->GetNumericValue(), setterValue, requestContext);
        }

        return None;
    }